

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelInternalFormatCase::checkTextureState
          (TextureLevelInternalFormatCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  ostringstream *poVar1;
  int *piVar2;
  int level;
  int expected;
  GLenum GVar3;
  QueryType QVar4;
  TestLog *pTVar5;
  bool bVar6;
  bool bVar7;
  qpTestResult qVar8;
  DataType DVar9;
  pointer pTVar10;
  GLfloat *pGVar11;
  GLint *pGVar12;
  MessageBuilder *pMVar13;
  pointer pTVar14;
  Enum<int,_2UL> *value;
  int ndx;
  long lVar15;
  int ndx_1;
  int initialValues [2];
  QueriedState state;
  string local_250;
  TextureLevelInternalFormatCase *local_230;
  TextureGenerationSpec *local_228;
  long local_220;
  long local_218;
  Enum<int,_2UL> local_210;
  ResultCollector result;
  MessageBuilder msg;
  
  pTVar14 = (spec->levels).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar10 = (spec->levels).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar14 != pTVar10) {
    bVar7 = true;
    local_218 = 0x10;
    poVar1 = &msg.m_str;
    local_230 = this;
    local_228 = spec;
    for (local_220 = 0; local_220 < (int)(((long)pTVar10 - (long)pTVar14) / 0x18);
        local_220 = local_220 + 1) {
      level = *(int *)((long)pTVar14 + local_218 + -4);
      expected = *(int *)((long)&pTVar14->width + local_218);
      GVar3 = local_228->queryTarget;
      QVar4 = (local_230->super_TextureLevelCase).m_type;
      deqp::gls::StateQueryUtil::QueriedState::QueriedState(&state);
      pTVar5 = gl->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg," // ERROR: ",(allocator<char> *)&local_250);
      tcu::ResultCollector::ResultCollector(&result,pTVar5,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      msg.m_log = gl->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Verifying ");
      local_210.m_getName = glu::getTextureLevelParameterName;
      local_210.m_value = 0x1003;
      tcu::Format::Enum<int,_2UL>::toStream
                (&local_210,&poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", expecting ");
      initialValues = (int  [2])glu::getTextureFormatName;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_250,(de *)initialValues,value);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)&local_250);
      tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      deqp::gls::StateQueryUtil::queryTextureLevelState(&result,gl,QVar4,GVar3,level,0x1003,&state);
      bVar6 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&state);
      if (bVar6) {
        bVar6 = false;
      }
      else {
        deqp::gls::StateQueryUtil::verifyInteger(&result,&state,expected);
        qVar8 = tcu::ResultCollector::getResult(&result);
        bVar6 = qVar8 == QP_TEST_RESULT_PASS;
      }
      tcu::ResultCollector::~ResultCollector(&result);
      bVar7 = (bool)(bVar7 & bVar6);
      pTVar14 = (local_228->levels).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar10 = (local_228->levels).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_218 = local_218 + 0x18;
    }
    return bVar7;
  }
  initialValues[0] = 0x1908;
  initialValues[1] = 0x8229;
  GVar3 = spec->queryTarget;
  QVar4 = (this->super_TextureLevelCase).m_type;
  deqp::gls::StateQueryUtil::QueriedState::QueriedState(&state);
  pTVar5 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg," // ERROR: ",(allocator<char> *)&local_250);
  tcu::ResultCollector::ResultCollector(&result,pTVar5,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  msg.m_log = gl->m_log;
  poVar1 = &msg.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"Verifying ");
  local_250._M_dataplus._M_p = (pointer)glu::getTextureLevelParameterName;
  local_250._M_string_length._0_4_ = 0x1003;
  tcu::Format::Enum<int,_2UL>::toStream
            ((Enum<int,_2UL> *)&local_250,
             &poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", expecting any of {"
                 );
  lVar15 = 0;
  do {
    if (lVar15 != 0) {
      if (lVar15 == 2) break;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    }
    local_250._M_string_length._0_4_ = initialValues[lVar15];
    local_250._M_dataplus._M_p = (pointer)glu::getTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream
              ((Enum<int,_2UL> *)&local_250,
               &poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
    lVar15 = lVar15 + 1;
  } while( true );
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"}");
  tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  deqp::gls::StateQueryUtil::queryTextureLevelState(&result,gl,QVar4,GVar3,0,0x1003,&state);
  bVar7 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&state);
  if (bVar7) {
LAB_0129f174:
    bVar7 = false;
  }
  else {
    DVar9 = deqp::gls::StateQueryUtil::QueriedState::getType(&state);
    if (DVar9 == DATATYPE_INTEGER) {
      lVar15 = 0;
      do {
        if (lVar15 == 2) {
          msg.m_log = gl->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
          std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                          "Error: got ");
          pGVar12 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess(&state);
          pMVar13 = tcu::MessageBuilder::operator<<(&msg,pGVar12);
          poVar1 = &pMVar13->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", (");
          pGVar12 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess(&state);
          local_250._M_string_length._0_4_ = *pGVar12;
          local_250._M_dataplus._M_p = (pointer)glu::getTextureFormatName;
          tcu::Format::Enum<int,_2UL>::toStream
                    ((Enum<int,_2UL> *)&local_250,
                     &poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0129f16c;
        }
        pGVar12 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess(&state);
        piVar2 = initialValues + lVar15;
        lVar15 = lVar15 + 1;
      } while (*pGVar12 != *piVar2);
    }
    else {
      if (DVar9 != DATATYPE_FLOAT) goto LAB_0129f174;
      lVar15 = 0;
      do {
        if (lVar15 == 2) {
          msg.m_log = gl->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
          std::operator<<(&msg.m_str.super_basic_ostream<char,_std::char_traits<char>_>,
                          "Error: got ");
          pGVar11 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess(&state);
          pMVar13 = tcu::MessageBuilder::operator<<(&msg,pGVar11);
          poVar1 = &pMVar13->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", (");
          pGVar11 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess(&state);
          local_250._M_string_length._0_4_ = (int)*pGVar11;
          local_250._M_dataplus._M_p = (pointer)glu::getTextureFormatName;
          tcu::Format::Enum<int,_2UL>::toStream
                    ((Enum<int,_2UL> *)&local_250,
                     &poVar1->super_basic_ostream<char,_std::char_traits<char>_>);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")");
          tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0129f16c:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg.m_str);
          goto LAB_0129f174;
        }
        pGVar11 = deqp::gls::StateQueryUtil::QueriedState::getFloatAccess(&state);
        piVar2 = initialValues + lVar15;
        lVar15 = lVar15 + 1;
      } while ((*pGVar11 != (float)*piVar2) || (NAN(*pGVar11) || NAN((float)*piVar2)));
    }
    bVar7 = true;
  }
  tcu::ResultCollector::~ResultCollector(&result);
  return bVar7;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			const int queryLevel		= 0;
			const int initialValues[2]	= { GL_RGBA, GL_R8 };

			allOk &= verifyTextureLevelParameterInternalFormatAnyOf(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, initialValues, DE_LENGTH_OF_ARRAY(initialValues), m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].internalFormat;

				allOk &= verifyTextureLevelParameterInternalFormatEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_INTERNAL_FORMAT, refValue, m_type);
			}
		}

		return allOk;
	}